

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O0

void nukedopl3_update(void *chip,UINT32 samples,DEV_SMPL **out)

{
  uint local_34;
  int local_30;
  UINT32 i;
  int32_t buffers [2];
  opl3_chip *opl3;
  DEV_SMPL **out_local;
  UINT32 samples_local;
  void *chip_local;
  
  buffers = (int32_t  [2])chip;
  if (*(char *)((long)chip + 0x119b) == '\0') {
    for (local_34 = 0; local_34 < samples; local_34 = local_34 + 1) {
      NOPL3_GenerateResampled((opl3_chip *)buffers,&local_30);
      (*out)[local_34] = local_30 * *(int *)((long)buffers + 0x11ec) >> 0xc;
      out[1][local_34] = (int)(i * *(int *)((long)buffers + 0x11f0)) >> 0xc;
    }
  }
  else {
    memset(*out,0,(ulong)samples << 2);
    memset(out[1],0,(ulong)samples << 2);
    if (*(int *)((long)buffers + 0x11c0) == 0x400) {
      local_34 = 0;
      while ((local_34 < samples &&
             ((*(ushort *)((long)buffers + (ulong)*(uint *)((long)buffers + 0x1200) * 0x10 + 0x1218)
              & 0x200) != 0))) {
        NOPL3_Generate4Ch((opl3_chip *)buffers,(int32_t *)((long)buffers + 0x11d8));
        local_34 = local_34 + 1;
      }
    }
    else {
      *(UINT32 *)((long)buffers + 0x11c4) = samples * 0x400 + *(int *)((long)buffers + 0x11c4);
      while (*(int *)((long)buffers + 0x11c0) <= *(int *)((long)buffers + 0x11c4)) {
        if ((*(ushort *)((long)buffers + (ulong)*(uint *)((long)buffers + 0x1200) * 0x10 + 0x1218) &
            0x200) == 0) {
          *(undefined4 *)((long)buffers + 0x11c4) = 0;
          return;
        }
        NOPL3_Generate4Ch((opl3_chip *)buffers,(int32_t *)((long)buffers + 0x11d8));
        *(int *)((long)buffers + 0x11c4) =
             *(int *)((long)buffers + 0x11c4) - *(int *)((long)buffers + 0x11c0);
      }
    }
  }
  return;
}

Assistant:

void nukedopl3_update(void *chip, UINT32 samples, DEV_SMPL **out)
{
	opl3_chip* opl3 = (opl3_chip*)chip;
	int32_t buffers[2];
	UINT32 i;

	if (opl3->isDisabled)
	{
		// Speed hack for possibly unused FM-part of OPL4 chip
		memset(out[0], 0, samples * sizeof(DEV_SMPL));
		memset(out[1], 0, samples * sizeof(DEV_SMPL));
#ifdef NOPL_ENABLE_WRITEBUF
		// make sure that the enqueued register writes get processed properly
		if (opl3->rateratio == (1 << RSM_FRAC))
		{
			for( i=0; i < samples ; i++ )
			{
				if (!(opl3->writebuf[opl3->writebuf_cur].reg & 0x200))
					break;
				NOPL3_Generate4Ch(opl3, opl3->samples);
			}
		}
		else
		{
			opl3->samplecnt += samples << RSM_FRAC;
			while(opl3->samplecnt >= opl3->rateratio)
			{
				if (!(opl3->writebuf[opl3->writebuf_cur].reg & 0x200))
				{
					opl3->samplecnt = 0;
					break;
				}
				NOPL3_Generate4Ch(opl3, opl3->samples);
				opl3->samplecnt -= opl3->rateratio;
			}
		}
#endif
		return;
	}

	for( i=0; i < samples ; i++ )
	{
		NOPL3_GenerateResampled(opl3, buffers);
		out[0][i] = (buffers[0] * opl3->masterVolL) >> 12;
		out[1][i] = (buffers[1] * opl3->masterVolR) >> 12;
	}
}